

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int filevisit(int f,int n)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  buffer *bp;
  char local_428 [8];
  char fname [1024];
  
  iVar1 = getbufcwd(local_428,0x400);
  if (iVar1 != 1) {
    local_428[0] = '\0';
  }
  iVar1 = 0;
  pcVar3 = eread("Find file: ",local_428,0x400,0x3c);
  if (pcVar3 == (char *)0x0) {
    iVar2 = 2;
  }
  else {
    iVar2 = 0;
    if (*pcVar3 != '\0') {
      pcVar3 = adjustname(local_428,1);
      iVar2 = iVar1;
      if (pcVar3 != (char *)0x0) {
        iVar1 = fisdir(pcVar3);
        if (iVar1 == 1) {
          iVar2 = do_dired(pcVar3);
        }
        else {
          bp = findbuffer(pcVar3);
          if (bp != (buffer *)0x0) {
            curbp = bp;
            iVar1 = showbuffer(bp,curwp,8);
            if ((iVar1 == 1) && (iVar2 = 1, bp->b_fname[0] == '\0')) {
              iVar2 = readin(pcVar3);
              if (iVar2 == 0) {
                killbuffer(bp);
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int
filevisit(int f, int n)
{
	struct buffer	*bp;
	char	 fname[NFILEN], *bufp, *adjf;
	int	 status;

	if (getbufcwd(fname, sizeof(fname)) != TRUE)
		fname[0] = '\0';
	bufp = eread("Find file: ", fname, NFILEN,
	    EFNEW | EFCR | EFFILE | EFDEF);
	if (bufp == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	adjf = adjustname(fname, TRUE);
	if (adjf == NULL)
		return (FALSE);
	if (fisdir(adjf) == TRUE)
		return (do_dired(adjf));
	if ((bp = findbuffer(adjf)) == NULL)
		return (FALSE);
	curbp = bp;
	if (showbuffer(bp, curwp, WFFULL) != TRUE)
		return (FALSE);
	if (bp->b_fname[0] == '\0') {
		if ((status = readin(adjf)) != TRUE)
			killbuffer(bp);
		return (status);
	}
	return (TRUE);
}